

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotILikeOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee8;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff77;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  UnifiedVectorFormat *in_stack_ffffffffffffff80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  string_t *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  ValidityMask *in_stack_ffffffffffffffb0;
  ValidityMask *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88._M_pi,
             in_stack_ffffffffffffff80);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff90,(idx_t)in_stack_ffffffffffffff88._M_pi,
             in_stack_ffffffffffffff80);
  Vector::SetVectorType(in_stack_fffffffffffffef0,vector_type_p);
  FlatVector::GetData<bool>((Vector *)0x13bfd3d);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  this = (UnifiedVectorFormat *)&stack0xffffffffffffff48;
  FlatVector::Validity((Vector *)0x13bfdbe);
  ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::NotILikeOperator,bool>
            ((string_t *)in_stack_ffffffffffffffa0._M_pi,in_stack_ffffffffffffff98,
             (bool *)in_stack_ffffffffffffff90,(SelectionVector *)in_stack_ffffffffffffff88._M_pi,
             (SelectionVector *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,
             (ValidityMask *)in_stack_ffffffffffffffc0._M_pi,(bool)in_stack_ffffffffffffff77);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}